

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

void __thiscall rengine::OpenGLRenderer::build(OpenGLRenderer *this,Node *n)

{
  vec2 vVar1;
  vec2 vVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  Element *pEVar6;
  vec2 vVar7;
  vec2 vVar8;
  vec2 vVar9;
  vec2 vVar10;
  vec2 vVar11;
  vec2 vVar12;
  bool bVar13;
  mat4 o;
  int i;
  uint uVar14;
  Node *pNVar15;
  long lVar16;
  undefined4 *puVar17;
  undefined8 *puVar18;
  mat4 *pmVar19;
  float *pfVar20;
  undefined8 *puVar21;
  mat4 *pmVar22;
  mat4 *this_00;
  Element *pEVar23;
  byte bVar24;
  vec2 *pvVar25;
  byte bVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  vec3 vVar39;
  float in_stack_fffffffffffffe38 [16];
  mat4 local_174;
  undefined8 local_130 [8];
  uint local_f0;
  float local_ec [2];
  mat4 old;
  vec3 v;
  
  bVar26 = 0;
  bVar24 = n->field_0x30;
  switch(bVar24) {
  case 1:
    fVar31 = *(float *)&n[2].super_SignalEmitter.m_buckets;
    if (((fVar31 == 0.0) && (!NAN(fVar31))) || ((this->field_0x1f8 & 1) != 0)) {
      pEVar23 = (Element *)0x0;
    }
    else {
      this->field_0x1f8 = this->field_0x1f8 | 1;
      this->m_farPlane = *(float *)&n[2].super_SignalEmitter.m_buckets;
      pEVar6 = this->m_elements;
      uVar14 = this->m_elementIndex;
      this->m_elementIndex = uVar14 + 1;
      pEVar23 = pEVar6 + uVar14;
      pEVar6[uVar14].node = n;
      pEVar6[uVar14].z = 0.0;
      pEVar6[uVar14].field_0x1b = pEVar6[uVar14].field_0x1b | 0x20;
    }
    this_00 = &this->m_m2d;
    if ((this->field_0x1f8 & 1) != 0) {
      this_00 = &this->m_m3d;
    }
    pmVar19 = this_00;
    pfVar20 = local_ec;
    for (lVar16 = 0x11; lVar16 != 0; lVar16 = lVar16 + -1) {
      *pfVar20 = pmVar19->m[0];
      pmVar19 = (mat4 *)(pmVar19->m + 1);
      pfVar20 = pfVar20 + 1;
    }
    puVar17 = (undefined4 *)&n->field_0x34;
    puVar18 = local_130;
    for (lVar16 = 0x11; lVar16 != 0; lVar16 = lVar16 + -1) {
      *(undefined4 *)puVar18 = *puVar17;
      puVar17 = puVar17 + 1;
      puVar18 = (undefined8 *)((long)puVar18 + 4);
    }
    puVar18 = local_130;
    puVar21 = (undefined8 *)&stack0xfffffffffffffe38;
    for (lVar16 = 8; lVar16 != 0; lVar16 = lVar16 + -1) {
      *puVar21 = *puVar18;
      puVar18 = puVar18 + 1;
      puVar21 = puVar21 + 1;
    }
    o.type = local_f0;
    o.m[0] = in_stack_fffffffffffffe38[0];
    o.m[1] = in_stack_fffffffffffffe38[1];
    o.m[2] = in_stack_fffffffffffffe38[2];
    o.m[3] = in_stack_fffffffffffffe38[3];
    o.m[4] = in_stack_fffffffffffffe38[4];
    o.m[5] = in_stack_fffffffffffffe38[5];
    o.m[6] = in_stack_fffffffffffffe38[6];
    o.m[7] = in_stack_fffffffffffffe38[7];
    o.m[8] = in_stack_fffffffffffffe38[8];
    o.m[9] = in_stack_fffffffffffffe38[9];
    o.m[10] = in_stack_fffffffffffffe38[10];
    o.m[0xb] = in_stack_fffffffffffffe38[0xb];
    o.m[0xc] = in_stack_fffffffffffffe38[0xc];
    o.m[0xd] = in_stack_fffffffffffffe38[0xd];
    o.m[0xe] = in_stack_fffffffffffffe38[0xe];
    o.m[0xf] = in_stack_fffffffffffffe38[0xf];
    mat4::operator*(&local_174,this_00,o);
    pmVar19 = &local_174;
    pmVar22 = this_00;
    for (lVar16 = 0x11; lVar16 != 0; lVar16 = lVar16 + -1) {
      pmVar22->m[0] = pmVar19->m[0];
      pmVar19 = (mat4 *)((long)pmVar19 + (ulong)bVar26 * -8 + 4);
      pmVar22 = (mat4 *)((long)pmVar22 + (ulong)bVar26 * -8 + 4);
    }
    for (pNVar15 = n->m_child; pNVar15 != (Node *)0x0; pNVar15 = Node::sibling(pNVar15)) {
      build(this,pNVar15);
    }
    pfVar20 = local_ec;
    for (lVar16 = 0x11; lVar16 != 0; lVar16 = lVar16 + -1) {
      this_00->m[0] = *pfVar20;
      pfVar20 = pfVar20 + (ulong)bVar26 * -2 + 1;
      this_00 = (mat4 *)((long)this_00 + (ulong)bVar26 * -8 + 4);
    }
    if (pEVar23 == (Element *)0x0) {
      return;
    }
    this->field_0x1f8 = this->field_0x1f8 & 0xfe;
    this->m_farPlane = 0.0;
    *(uint *)&pEVar23->field_0x18 =
         *(uint *)&pEVar23->field_0x18 & 0xe0000000 |
         (int)((long)this->m_elements + ((ulong)this->m_elementIndex * 0x20 - (long)pEVar23) >> 5) -
         1U & 0x1fffffff;
    return;
  case 2:
    bVar13 = true;
    if (*(float *)&n->field_0x34 <= 1.0 && *(float *)&n->field_0x34 != 1.0) goto LAB_0012e065;
    goto LAB_0012e063;
  case 3:
    iVar4 = *(int *)((long)&n[2].super_SignalEmitter._vptr_SignalEmitter + 4);
    break;
  case 4:
    iVar4 = *(int *)&n->field_0x34;
    break;
  case 5:
    bVar13 = 0.0 < *(float *)((long)&n[1].m_parent + 4);
    goto LAB_0012e065;
  default:
    if (bVar24 - 0x41 < 2) {
      vVar1 = *(vec2 *)&n->field_0x34;
      fVar35 = vVar1.x;
      fVar27 = vVar1.y;
      vVar2 = *(vec2 *)((long)&n[1].super_SignalEmitter._vptr_SignalEmitter + 4);
      fVar31 = vVar2.x;
      fVar33 = vVar2.y;
      if (((fVar31 - fVar35 != 0.0) || (NAN(fVar31 - fVar35))) &&
         ((fVar33 - fVar27 != 0.0 || (NAN(fVar33 - fVar27))))) {
        if (bVar24 == 0x42) {
          if (n[1].m_parent == (Node *)0x0) goto LAB_0012dffe;
        }
        else if (*(float *)&n[1].m_child < 0.001) goto LAB_0012dffe;
        pEVar23 = this->m_elements;
        uVar14 = this->m_elementIndex;
        pEVar23[uVar14].node = n;
        uVar5 = this->m_vertexIndex;
        pEVar23[uVar14].vboOffset = uVar5;
        pvVar25 = this->m_vertices + uVar5;
        if ((this->field_0x1f8 & 1) == 0) {
          vVar2.y = (this->m_m2d).m[4] * fVar35 + (this->m_m2d).m[5] * fVar27 + (this->m_m2d).m[7];
          vVar2.x = (this->m_m2d).m[0] * fVar35 + (this->m_m2d).m[1] * fVar27 + (this->m_m2d).m[3];
          *pvVar25 = vVar2;
          vVar10.y = fVar35 * (this->m_m2d).m[4] + (this->m_m2d).m[5] * fVar33 + (this->m_m2d).m[7];
          vVar10.x = (this->m_m2d).m[0] * fVar35 + (this->m_m2d).m[1] * fVar33 + (this->m_m2d).m[3];
          pvVar25[1] = vVar10;
          vVar11.y = (this->m_m2d).m[4] * fVar31 + fVar27 * (this->m_m2d).m[5] + (this->m_m2d).m[7];
          vVar11.x = (this->m_m2d).m[0] * fVar31 + (this->m_m2d).m[1] * fVar27 + (this->m_m2d).m[3];
          pvVar25[2] = vVar11;
          vVar1.y = fVar31 * (this->m_m2d).m[4] + fVar33 * (this->m_m2d).m[5] + (this->m_m2d).m[7];
          vVar1.x = (this->m_m2d).m[0] * fVar31 + (this->m_m2d).m[1] * fVar33 + (this->m_m2d).m[3];
          pvVar25[3] = vVar1;
        }
        else {
          v.x = (fVar35 + fVar31) * 0.5;
          v.y = (fVar27 + fVar33) * 0.5;
          v.z = 0.0;
          vVar39 = mat4::operator*(&this->m_m3d,v);
          pEVar23[uVar14].z = vVar39.z;
          projectQuad(this,vVar1,vVar2,pvVar25);
        }
        this->m_vertexIndex = this->m_vertexIndex + 4;
        this->m_elementIndex = this->m_elementIndex + 1;
        if ((this->field_0x1f8 & 2) != 0) {
          fVar31 = (this->m_layerBoundingBox).tl.x;
          fVar33 = (this->m_layerBoundingBox).tl.y;
          fVar35 = (this->m_layerBoundingBox).br.x;
          fVar27 = (this->m_layerBoundingBox).br.y;
          lVar16 = 0;
          do {
            vVar1 = pvVar25[lVar16];
            fVar28 = vVar1.x;
            if (fVar28 < fVar31) {
              (this->m_layerBoundingBox).tl.x = fVar28;
              fVar31 = fVar28;
            }
            fVar29 = vVar1.y;
            if (fVar29 < fVar33) {
              (this->m_layerBoundingBox).tl.y = fVar29;
              fVar33 = fVar29;
            }
            if (fVar35 < fVar28) {
              (this->m_layerBoundingBox).br.x = fVar28;
              fVar35 = fVar28;
            }
            if (fVar27 < fVar29) {
              (this->m_layerBoundingBox).br.y = fVar29;
              fVar27 = fVar29;
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
        }
      }
    }
    else if (bVar24 == 0x43) {
      pEVar23 = this->m_elements;
      uVar14 = this->m_elementIndex;
      this->m_elementIndex = uVar14 + 1;
      pEVar23[uVar14].node = n;
      if ((this->field_0x1f8 & 1) != 0) {
        uVar3 = *(undefined8 *)((long)&n[1].super_SignalEmitter._vptr_SignalEmitter + 4);
        vVar39.x = ((float)uVar3 + (float)*(undefined8 *)&n->field_0x34) * 0.5;
        vVar39.y = ((float)((ulong)uVar3 >> 0x20) +
                   (float)((ulong)*(undefined8 *)&n->field_0x34 >> 0x20)) * 0.5;
        vVar39.z = 0.0;
        vVar39 = mat4::operator*(&this->m_m3d,vVar39);
        pEVar23[uVar14].z = vVar39.z;
      }
    }
LAB_0012dffe:
    for (pNVar15 = n->m_child; pNVar15 != (Node *)0x0; pNVar15 = Node::sibling(pNVar15)) {
      build(this,pNVar15);
    }
    return;
  }
  bVar13 = true;
  if (iVar4 == 0) {
LAB_0012e063:
    bVar13 = false;
  }
LAB_0012e065:
  bVar24 = this->field_0x1f8;
  fVar31 = (this->m_layerBoundingBox).tl.x;
  fVar33 = (this->m_layerBoundingBox).tl.y;
  fVar35 = (this->m_layerBoundingBox).br.y;
  unique0x100001f5 = ZEXT416((uint)(this->m_layerBoundingBox).br.x);
  if (bVar13) {
    this->field_0x1f8 = bVar24 | 2;
    pEVar6 = this->m_elements;
    uVar14 = this->m_elementIndex;
    this->m_elementIndex = uVar14 + 1;
    pEVar23 = pEVar6 + uVar14;
    pEVar6[uVar14].node = n;
    *(uint *)&pEVar6[uVar14].field_0x18 =
         ((byte)this->field_0x1f8 & 1) * 0x20000000 +
         (*(uint *)&pEVar6[uVar14].field_0x18 & 0x9fffffff) + 0x40000000;
    (this->m_layerBoundingBox).tl.x = INFINITY;
    (this->m_layerBoundingBox).tl.y = INFINITY;
    (this->m_layerBoundingBox).br.x = -INFINITY;
    (this->m_layerBoundingBox).br.y = -INFINITY;
  }
  else {
    pEVar23 = (Element *)0x0;
  }
  for (pNVar15 = n->m_child; pNVar15 != (Node *)0x0; pNVar15 = Node::sibling(pNVar15)) {
    build(this,pNVar15);
  }
  if (pEVar23 != (Element *)0x0) {
    bVar24 = bVar24 & 2;
    this->field_0x1f8 = this->field_0x1f8 & 0xfd | bVar24;
    *(uint *)&pEVar23->field_0x18 =
         *(uint *)&pEVar23->field_0x18 & 0xe0000000 |
         (int)((long)this->m_elements + ((ulong)this->m_elementIndex * 0x20 - (long)pEVar23) >> 5) -
         1U & 0x1fffffff;
    uVar14 = this->m_vertexIndex;
    pEVar23->vboOffset = uVar14;
    fVar27 = floorf((this->m_layerBoundingBox).tl.x);
    fVar28 = floorf((this->m_layerBoundingBox).tl.y);
    fVar29 = ceilf((this->m_layerBoundingBox).br.x);
    fVar30 = ceilf((this->m_layerBoundingBox).br.y);
    pvVar25 = this->m_vertices;
    vVar8.y = fVar28;
    vVar8.x = fVar27;
    pvVar25[uVar14] = vVar8;
    pvVar25[(ulong)uVar14 + 1].x = fVar27;
    pvVar25[(ulong)uVar14 + 1].y = fVar30;
    pvVar25[(ulong)uVar14 + 2].x = fVar29;
    pvVar25[(ulong)uVar14 + 2].y = fVar28;
    vVar9.y = fVar30;
    vVar9.x = fVar29;
    pvVar25[(ulong)uVar14 + 3] = vVar9;
    this->m_vertexIndex = this->m_vertexIndex + 4;
    if ((*(uint *)&n->field_0x30 & 0xfe) == 4) {
      fVar36 = (float)*(uint *)&n->field_0x34;
      fVar32 = fVar28 + -1.0;
      fVar34 = fVar30 + 1.0;
      fVar37 = fVar27 - fVar36;
      fVar38 = fVar29 + fVar36;
      pvVar25[(ulong)uVar14 + 4].x = fVar37;
      pvVar25[(ulong)uVar14 + 4].y = fVar32;
      pvVar25[(ulong)uVar14 + 5].x = fVar37;
      pvVar25[(ulong)uVar14 + 5].y = fVar34;
      pvVar25[(ulong)uVar14 + 6].x = fVar38;
      pvVar25[(ulong)uVar14 + 6].y = fVar32;
      pvVar25[(ulong)uVar14 + 7].x = fVar38;
      pvVar25[(ulong)uVar14 + 7].y = fVar34;
      pvVar25[(ulong)uVar14 + 8].x = fVar37;
      pvVar25[(ulong)uVar14 + 8].y = fVar28 - fVar36;
      pvVar25[(ulong)uVar14 + 9].x = fVar37;
      pvVar25[(ulong)uVar14 + 9].y = fVar30 + fVar36;
      pvVar25[(ulong)uVar14 + 10].x = fVar38;
      pvVar25[(ulong)uVar14 + 10].y = fVar28 - fVar36;
      pvVar25[(ulong)uVar14 + 0xb].x = fVar38;
      pvVar25[(ulong)uVar14 + 0xb].y = fVar30 + fVar36;
      this->m_vertexIndex = this->m_vertexIndex + 8;
      if (n->field_0x30 == '\x05') {
        vVar7.y = fVar32;
        vVar7.x = fVar27 + -1.0;
        pvVar25[(ulong)uVar14 + 0xc] = vVar7;
        pvVar25[(ulong)uVar14 + 0xd].x = fVar27 + -1.0;
        pvVar25[(ulong)uVar14 + 0xd].y = fVar34;
        pvVar25[(ulong)uVar14 + 0xe].x = fVar29 + 1.0;
        pvVar25[(ulong)uVar14 + 0xe].y = fVar32;
        vVar12.y = fVar34;
        vVar12.x = fVar29 + 1.0;
        pvVar25[(ulong)uVar14 + 0xf] = vVar12;
      }
    }
    if (bVar24 != 0) {
      vVar1 = (this->m_layerBoundingBox).tl;
      fVar28 = vVar1.x;
      fVar27 = vVar1.y;
      fVar29 = fVar28;
      if (fVar31 <= fVar28) {
        fVar29 = fVar31;
      }
      vVar1 = (this->m_layerBoundingBox).br;
      fVar32 = vVar1.x;
      fVar34 = vVar1.y;
      fVar30 = fVar27;
      if (fVar33 <= fVar27) {
        fVar30 = fVar33;
      }
      if (fVar28 <= old.m[0xf]) {
        fVar28 = old.m[0xf];
      }
      if (fVar27 <= fVar35) {
        fVar27 = fVar35;
      }
      fVar31 = fVar32;
      if (fVar29 <= fVar32) {
        fVar31 = fVar29;
      }
      fVar33 = fVar34;
      if (fVar30 <= fVar34) {
        fVar33 = fVar30;
      }
      old.m[0xf] = fVar32;
      if (fVar32 <= fVar28) {
        old.m[0xf] = fVar28;
      }
      fVar35 = fVar34;
      if (fVar34 <= fVar27) {
        fVar35 = fVar27;
      }
    }
    (this->m_layerBoundingBox).tl.x = fVar31;
    (this->m_layerBoundingBox).tl.y = fVar33;
    (this->m_layerBoundingBox).br.x = old.m[0xf];
    (this->m_layerBoundingBox).br.y = fVar35;
    if ((this->field_0x1f8 & 1) != 0) {
      uVar14 = *(uint *)&pEVar23->field_0x18 & 0x1fffffff;
      fVar31 = 0.0;
      lVar16 = 0;
      do {
        fVar31 = fVar31 + *(float *)((long)&pEVar23->z + lVar16);
        lVar16 = lVar16 + 0x20;
      } while ((ulong)uVar14 * 0x20 + 0x20 != lVar16);
      pEVar23->z = fVar31 / (float)uVar14;
    }
  }
  return;
}

Assistant:

inline void OpenGLRenderer::build(Node *n)
{
    switch (n->type()) {
    case Node::TextureNodeType:
    case Node::RectangleNodeType: {
        rect2d geometry = static_cast<RectangleNodeBase *>(n)->geometry();

        // Skip if empty..
        if (geometry.width() == 0 || geometry.height() == 0
            || (n->type() == Node::TextureNodeType && static_cast<TextureNode *>(n)->texture() == 0)
            || (n->type() == Node::RectangleNodeType && static_cast<RectangleNode *>(n)->color().w < RENGINE_RENDERER_ALPHA_THRESHOLD))
            break;

        Element *e = m_elements + m_elementIndex;
        e->node = n;
        e->vboOffset = m_vertexIndex;
        vec2 p1 = geometry.tl;
        vec2 p2 = geometry.br;
        vec2 *v = m_vertices + m_vertexIndex;

        // std::cout << " -- building rect from " << p1 << " " << p2 << " into " << m_vertices << " " << e << std::endl;

        if (m_render3d) {
            e->z = (m_m3d * vec3((p1 + p2) / 2.0f)).z;
            projectQuad(p1, p2, v);

        } else {
            v[0] = m_m2d * p1;
            v[1] = m_m2d * vec2(p1.x, p2.y);
            v[2] = m_m2d * vec2(p2.x, p1.y);
            v[3] = m_m2d * p2;
        }
        m_vertexIndex += 4;
        m_elementIndex += 1;

        // Add to the bounding box if we're in inside a layer
        if (m_layered) {
            for (int i=0; i<4; ++i)
                m_layerBoundingBox |= v[i];
            // std::cout << " ----> bounds: " << m_layerBoundingBox << std::endl;
        }

    } break;

    case Node::TransformNodeType: {
        TransformNode *tn = static_cast<TransformNode *>(n);

        Element *e = 0;

        if (tn->projectionDepth() && !m_render3d) {
            m_render3d = true;
            m_farPlane = tn->projectionDepth();
            e = m_elements + m_elementIndex++;
            e->node = n;
            e->z = 0;
            e->projection = true;
        }

        mat4 *m = m_render3d ? &m_m3d : &m_m2d;
        mat4 old = *m;
        *m = *m * tn->matrix();

        for (Node *c = n->child(); c; c = c->sibling())
            build(c);

        // restore previous state
        *m = old;
        if (e) {
            m_render3d = false;
            m_farPlane = 0;
            e->groupSize = (m_elements + m_elementIndex) - e - 1;
        }
    } return;

    // all layered node types take this code path
    case Node::ShadowNodeType:
    case Node::BlurNodeType:
    case Node::ColorFilterNodeType:
    case Node::OpacityNodeType: {

        bool useTexture =
            (n->type() == Node::OpacityNodeType && static_cast<OpacityNode *>(n)->opacity() < 1.0f)
            || (n->type() == Node::ColorFilterNodeType && !static_cast<ColorFilterNode *>(n)->colorMatrix().isIdentity())
            || (n->type() == Node::BlurNodeType && static_cast<BlurNode *>(n)->radius() > 0)
            || (n->type() == Node::ShadowNodeType && static_cast<ShadowNode *>(n)->color().w > 0);

        bool storedTextureed = m_layered;
        Element *e = 0;
        rect2d storedBox = m_layerBoundingBox;

        if (useTexture) {
            m_layered = true;
            e = m_elements + m_elementIndex++;
            e->node = n;
            e->projection = m_render3d;
            e->layered = true;
            const float inf = std::numeric_limits<float>::infinity();
            m_layerBoundingBox = rect2d(inf, inf, -inf, -inf);
        }
        // std::cout << " -- building layered node into " << e << std::endl;

        for (Node *c = n->child(); c; c = c->sibling())
            build(c);

        if (e) {
            m_layered = storedTextureed;
            e->groupSize = (m_elements + m_elementIndex) - e - 1;
            // std::cout << "groupSize of " << e << " is " << e->groupSize << " based on: " << m_elements << " " << m_elementIndex << " " << e << std::endl;
            e->vboOffset = m_vertexIndex;
            rect2d box = m_layerBoundingBox.aligned();
            vec2 *v = m_vertices + m_vertexIndex;
            v[0] = box.tl;
            v[1] = vec2(box.left(), box.bottom());
            v[2] = vec2(box.right(), box.top());
            v[3] = box.br;
            m_vertexIndex += 4;

            if (n->type() == Node::BlurNodeType || n->type() == Node::ShadowNodeType) {
                float radius = n->type() == Node::BlurNodeType
                               ? static_cast<BlurNode *>(n)->radius()
                               : static_cast<ShadowNode *>(n)->radius();
                float t1 = box.tl.y - 1;
                float b1 = box.br.y + 1;
                vec2 tlr = box.tl - vec2(radius);
                vec2 brr = box.br + vec2(radius);
                v[ 4] = vec2(tlr.x, t1);
                v[ 5] = vec2(tlr.x, b1);
                v[ 6] = vec2(brr.x, t1);
                v[ 7] = vec2(brr.x, b1);
                v[ 8] = vec2(tlr.x, tlr.y);
                v[ 9] = vec2(tlr.x, brr.y);
                v[10] = vec2(brr.x, tlr.y);
                v[11] = vec2(brr.x, brr.y);
                m_vertexIndex += 8;

                if (n->type() == Node::ShadowNodeType) {
                    v[12] = box.tl - 1.0;
                    v[13] = vec2(box.left() - 1, box.bottom() + 1);
                    v[14] = vec2(box.right() + 1, box.top() - 1);
                    v[15] = box.br + 1;
                }
            }

            // We're a nested layer, accumulate the layered bounding box into
            // the stored one..
            if (storedTextureed)
                storedBox |= m_layerBoundingBox;

            m_layerBoundingBox = storedBox;
            if (m_render3d) {
                // Let the opacity layer's z be the average of all its children..
                float z = 0;
                for (unsigned i=0; i<=e->groupSize; ++i)
                    z += (e+i)->z;
                e->z = z / e->groupSize;
            }
        }

    } return;

    case Node::RenderNodeType: {
        Element *e = m_elements + m_elementIndex++;
        e->node = n;
        rect2d geometry = static_cast<RectangleNodeBase *>(n)->geometry();
        vec2 p1 = geometry.tl;
        vec2 p2 = geometry.br;
        // This will "kinda" work. As long as our 3d support is based on back-
        // to-front ordering of the center of primitives, we might as well
        // order render nodes back-to-front as well. The usercase is a bit
        // broken though..
        if (m_render3d)
            e->z = (m_m3d * vec3((p1 + p2) / 2.0f)).z;
        break;
    }

    default:
        break;
    }

    for (Node *c = n->child(); c; c = c->sibling())
        build(c);


}